

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O1

void __thiscall CTextRender::Init(CTextRender *this)

{
  IKernel *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  CGlyphMap *this_00;
  
  pIVar1 = (this->super_IEngineTextRender).super_ITextRender.super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"graphics");
  this->m_pGraphics = (IGraphics *)CONCAT44(extraout_var,iVar2);
  FT_Init_FreeType(&this->m_FTLibrary);
  this_00 = (CGlyphMap *)operator_new(0x458);
  CGlyphMap::CGlyphMap(this_00,this->m_pGraphics,this->m_FTLibrary);
  this->m_pGlyphMap = this_00;
  return;
}

Assistant:

void CTextRender::Init()
{
	m_pGraphics = Kernel()->RequestInterface<IGraphics>();
	FT_Init_FreeType(&m_FTLibrary);
	m_pGlyphMap = new CGlyphMap(m_pGraphics, m_FTLibrary);
}